

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist.cpp
# Opt level: O3

void DeleteAt(LinkedList *L)

{
  Node *ptr;
  
  if (L->currPtr != (Node *)0x0) {
    if (L->prevPtr == (Node *)0x0) {
      ptr = L->front;
      L->front = L->currPtr->next;
    }
    else {
      ptr = DeleteAfter(L->prevPtr);
    }
    if (ptr == L->rear) {
      L->rear = L->prevPtr;
    }
    L->currPtr = ptr->next;
    FreeNode(ptr);
    L->size = L->size + -1;
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DeleteAt: current position is invalid!",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  return;
}

Assistant:

void DeleteAt(LinkedList *L) { //链表中删除当前结点的函数
    Node *oldNode;
    if(!L->currPtr) {   //若表为空或已到表尾，则给出错误提示并返回
        cout << "DeleteAt: current position is invalid!" << endl;
        return ;
    }
    if(!L->prevPtr) {   //若删除的是表头结点
        oldNode = L->front;
        L->front = (L->currPtr)->next;
    } else {   //若删除的是表中结点
        oldNode = DeleteAfter(L->prevPtr);
    }
    if(oldNode == L->rear) {  //若删除的是表未结点，则修改表尾指针
        L->rear = L->prevPtr;
    }
    L->currPtr = oldNode->next;   //新插入的结点作为当前结点
    FreeNode(oldNode);   //释放原当前结点
    L->size--;   //修改链表的大小
}